

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfoEx
               (SnapScriptFunctionInfo *snapFuncInfo,FileWriter *writer)

{
  FileWriter *writer_local;
  SnapScriptFunctionInfo *snapFuncInfo_local;
  
  FileWriter::WriteAddr(writer,functionBodyId,snapFuncInfo->BodyRefId,CommaAndBigSpaceSeparator);
  FileWriter::WriteString(writer,name,&snapFuncInfo->DebugFunctionName,CommaSeparator);
  FileWriter::WriteAddr(writer,cachedScopeObjId,snapFuncInfo->CachedScopeObjId,CommaSeparator);
  FileWriter::WriteAddr(writer,scopeId,snapFuncInfo->ScopeId,CommaSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,snapFuncInfo->HomeObjId,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x38,1);
  NSSnapValues::EmitTTDVar(snapFuncInfo->ComputedNameInfo,writer,NoSeparator);
  return;
}

Assistant:

void EmitAddtlInfo_SnapScriptFunctionInfoEx(const SnapScriptFunctionInfo* snapFuncInfo, FileWriter* writer)
        {

            writer->WriteAddr(NSTokens::Key::functionBodyId, snapFuncInfo->BodyRefId, NSTokens::Separator::CommaAndBigSpaceSeparator);

            writer->WriteString(NSTokens::Key::name, snapFuncInfo->DebugFunctionName, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::cachedScopeObjId, snapFuncInfo->CachedScopeObjId, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::scopeId, snapFuncInfo->ScopeId, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, snapFuncInfo->HomeObjId, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::nameInfo, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(snapFuncInfo->ComputedNameInfo, writer, NSTokens::Separator::NoSeparator);
        }